

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

problem * __thiscall
anon_unknown.dwarf_106e63::preprocessor<baryonyx::problem>::operator()
          (problem *__return_storage_ptr__,preprocessor<baryonyx::problem> *this,int variable_index,
          bool variable_value)

{
  undefined1 (*pauVar1) [32];
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [32];
  pointer ppVar5;
  pointer pcVar6;
  pointer piVar7;
  pointer poVar8;
  pointer poVar9;
  context *pcVar10;
  size_type sVar11;
  pointer pbVar12;
  pointer pbVar13;
  size_t __n;
  byte bVar14;
  double dVar15;
  ulong uVar16;
  char *pcVar17;
  undefined8 uVar18;
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 auVar19 [8];
  undefined1 auVar20 [16];
  bool bVar21;
  int iVar22;
  int iVar23;
  problem_solver_type pVar24;
  iterator iVar25;
  pointer poVar26;
  pointer poVar27;
  mapped_type *pmVar28;
  size_t sVar29;
  const_iterator cVar30;
  value_type vVar31;
  problem *ppVar32;
  problem *extraout_RAX;
  undefined8 extraout_RAX_00;
  int iVar33;
  long lVar34;
  value_type __args;
  pointer pcVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  pointer poVar39;
  pointer poVar40;
  tuple<double,_baryonyx::show_size_type> *mem;
  int *__args_1;
  basic_string_view<char,_std::char_traits<char>_> *__args_00;
  variable_value *__args_01;
  tuple<double,_baryonyx::show_size_type> *mem_00;
  pointer poVar41;
  long lVar42;
  double *__args_02;
  pointer pfVar43;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *in_R8;
  int iVar44;
  uint uVar45;
  long lVar46;
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  long lVar47;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 in_XMM6 [16];
  int i;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> mapping;
  index index_to_affect;
  int i_1;
  undefined1 local_2d8 [24];
  vector<signed_char,_std::allocator<signed_char>_> vStack_2c0;
  undefined1 local_2a8 [32];
  undefined1 local_288 [24];
  vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> vStack_270;
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_258;
  vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
  *local_250;
  undefined1 local_248 [8];
  value_type vStack_240;
  undefined1 auStack_238 [8];
  undefined1 auStack_230 [16];
  pointer poStack_220;
  pointer local_218;
  pointer local_208;
  pointer local_200;
  pointer local_1f0;
  ios_base local_150 [272];
  uint local_40 [2];
  double local_38;
  undefined1 auVar48 [32];
  
  this_01 = &(this->vars)._M_h;
  uVar38 = (ulong)(uint)variable_index;
  std::
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(this_01);
  ppVar5 = (this->lifo).data.
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lifo).data.
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    (this->lifo).data.
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  ppVar32 = this->pb;
  pcVar35 = (ppVar32->equal_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar6 = (ppVar32->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar35 != pcVar6) {
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_0061bfe0);
    vpmovsxwd_avx2(_DAT_0061bff0);
    piVar7 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x0;
    auVar53 = vpbroadcastq_avx512f();
    auVar53 = vpsrlq_avx512f(auVar53,5);
    uVar36 = (ulong)((long)pcVar6 + (-0x30 - (long)pcVar35)) / 0x30 + 8 & 0xffffffffffffff8;
    do {
      auVar54 = vpbroadcastq_avx512f();
      auVar54 = vporq_avx512f(auVar54,auVar52);
      uVar37 = vpcmpuq_avx512f(auVar54,auVar53,2);
      auVar54 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pcVar35->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar36));
      bVar14 = (byte)uVar37;
      auVar56._8_8_ = (ulong)((byte)(uVar37 >> 1) & 1) * auVar54._8_8_;
      auVar56._0_8_ = (ulong)(bVar14 & 1) * auVar54._0_8_;
      auVar56._16_8_ = (ulong)((byte)(uVar37 >> 2) & 1) * auVar54._16_8_;
      auVar56._24_8_ = (ulong)((byte)(uVar37 >> 3) & 1) * auVar54._24_8_;
      auVar56._32_8_ = (ulong)((byte)(uVar37 >> 4) & 1) * auVar54._32_8_;
      auVar56._40_8_ = (ulong)((byte)(uVar37 >> 5) & 1) * auVar54._40_8_;
      auVar56._48_8_ = (ulong)((byte)(uVar37 >> 6) & 1) * auVar54._48_8_;
      auVar56._56_8_ = (uVar37 >> 7) * auVar54._56_8_;
      auVar54 = vpgatherdq_avx512f(*(undefined4 *)((long)&(pcVar35->label)._M_len + uVar38));
      auVar55._8_8_ = (ulong)((byte)(uVar37 >> 1) & 1) * auVar54._8_8_;
      auVar55._0_8_ = (ulong)(bVar14 & 1) * auVar54._0_8_;
      auVar55._16_8_ = (ulong)((byte)(uVar37 >> 2) & 1) * auVar54._16_8_;
      auVar55._24_8_ = (ulong)((byte)(uVar37 >> 3) & 1) * auVar54._24_8_;
      auVar55._32_8_ = (ulong)((byte)(uVar37 >> 4) & 1) * auVar54._32_8_;
      auVar55._40_8_ = (ulong)((byte)(uVar37 >> 5) & 1) * auVar54._40_8_;
      auVar55._48_8_ = (ulong)((byte)(uVar37 >> 6) & 1) * auVar54._48_8_;
      auVar55._56_8_ = (uVar37 >> 7) * auVar54._56_8_;
      pcVar35 = pcVar35 + 8;
      auVar54 = vpsubq_avx512f(auVar55,auVar56);
      auVar54 = vpsrlq_avx512f(auVar54,3);
      pauVar1 = (undefined1 (*) [32])(piVar7 + (long)in_R8);
      auVar48 = vpmovqd_avx512f(auVar54);
      auVar4 = *pauVar1;
      auVar49._0_4_ = (uint)(bVar14 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar4._0_4_;
      bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar21 * auVar48._4_4_ | (uint)!bVar21 * auVar4._4_4_;
      bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar21 * auVar48._8_4_ | (uint)!bVar21 * auVar4._8_4_;
      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar21 * auVar48._12_4_ | (uint)!bVar21 * auVar4._12_4_;
      bVar21 = (bool)((byte)(uVar37 >> 4) & 1);
      auVar49._16_4_ = (uint)bVar21 * auVar48._16_4_ | (uint)!bVar21 * auVar4._16_4_;
      bVar21 = (bool)((byte)(uVar37 >> 5) & 1);
      auVar49._20_4_ = (uint)bVar21 * auVar48._20_4_ | (uint)!bVar21 * auVar4._20_4_;
      bVar21 = (bool)((byte)(uVar37 >> 6) & 1);
      auVar49._24_4_ = (uint)bVar21 * auVar48._24_4_ | (uint)!bVar21 * auVar4._24_4_;
      bVar21 = SUB81(uVar37 >> 7,0);
      auVar49._28_4_ = (uint)bVar21 * auVar48._28_4_ | (uint)!bVar21 * auVar4._28_4_;
      *pauVar1 = auVar49;
      in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
              ((long)in_R8 + 8);
    } while ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)uVar36 != in_R8)
    ;
  }
  pcVar35 = (ppVar32->greater_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar6 = (ppVar32->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar35 != pcVar6) {
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_0061bfe0);
    vpmovsxwd_avx2(_DAT_0061bff0);
    piVar7 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x0;
    auVar53 = vpbroadcastq_avx512f();
    auVar53 = vpsrlq_avx512f(auVar53,5);
    uVar36 = (ulong)((long)pcVar6 + (-0x30 - (long)pcVar35)) / 0x30 + 8 & 0xffffffffffffff8;
    do {
      auVar54 = vpbroadcastq_avx512f();
      auVar54 = vporq_avx512f(auVar54,auVar52);
      uVar37 = vpcmpuq_avx512f(auVar54,auVar53,2);
      auVar56 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pcVar35->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar36));
      bVar14 = (byte)uVar37;
      auVar54._8_8_ = (ulong)((byte)(uVar37 >> 1) & 1) * auVar56._8_8_;
      auVar54._0_8_ = (ulong)(bVar14 & 1) * auVar56._0_8_;
      auVar54._16_8_ = (ulong)((byte)(uVar37 >> 2) & 1) * auVar56._16_8_;
      auVar54._24_8_ = (ulong)((byte)(uVar37 >> 3) & 1) * auVar56._24_8_;
      auVar54._32_8_ = (ulong)((byte)(uVar37 >> 4) & 1) * auVar56._32_8_;
      auVar54._40_8_ = (ulong)((byte)(uVar37 >> 5) & 1) * auVar56._40_8_;
      auVar54._48_8_ = (ulong)((byte)(uVar37 >> 6) & 1) * auVar56._48_8_;
      auVar54._56_8_ = (uVar37 >> 7) * auVar56._56_8_;
      auVar56 = vpgatherdq_avx512f(*(undefined4 *)((long)&(pcVar35->label)._M_len + uVar38));
      auVar57._8_8_ = (ulong)((byte)(uVar37 >> 1) & 1) * auVar56._8_8_;
      auVar57._0_8_ = (ulong)(bVar14 & 1) * auVar56._0_8_;
      auVar57._16_8_ = (ulong)((byte)(uVar37 >> 2) & 1) * auVar56._16_8_;
      auVar57._24_8_ = (ulong)((byte)(uVar37 >> 3) & 1) * auVar56._24_8_;
      auVar57._32_8_ = (ulong)((byte)(uVar37 >> 4) & 1) * auVar56._32_8_;
      auVar57._40_8_ = (ulong)((byte)(uVar37 >> 5) & 1) * auVar56._40_8_;
      auVar57._48_8_ = (ulong)((byte)(uVar37 >> 6) & 1) * auVar56._48_8_;
      auVar57._56_8_ = (uVar37 >> 7) * auVar56._56_8_;
      pcVar35 = pcVar35 + 8;
      auVar54 = vpsubq_avx512f(auVar57,auVar54);
      auVar54 = vpsrlq_avx512f(auVar54,3);
      pauVar1 = (undefined1 (*) [32])(piVar7 + (long)in_R8);
      auVar48 = vpmovqd_avx512f(auVar54);
      auVar4 = *pauVar1;
      auVar50._0_4_ = (uint)(bVar14 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar4._0_4_;
      bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar21 * auVar48._4_4_ | (uint)!bVar21 * auVar4._4_4_;
      bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar21 * auVar48._8_4_ | (uint)!bVar21 * auVar4._8_4_;
      bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar21 * auVar48._12_4_ | (uint)!bVar21 * auVar4._12_4_;
      bVar21 = (bool)((byte)(uVar37 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar21 * auVar48._16_4_ | (uint)!bVar21 * auVar4._16_4_;
      bVar21 = (bool)((byte)(uVar37 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar21 * auVar48._20_4_ | (uint)!bVar21 * auVar4._20_4_;
      bVar21 = (bool)((byte)(uVar37 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar21 * auVar48._24_4_ | (uint)!bVar21 * auVar4._24_4_;
      bVar21 = SUB81(uVar37 >> 7,0);
      auVar50._28_4_ = (uint)bVar21 * auVar48._28_4_ | (uint)!bVar21 * auVar4._28_4_;
      *pauVar1 = auVar50;
      in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
              ((long)in_R8 + 8);
    } while ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)uVar36 != in_R8)
    ;
  }
  pcVar35 = (ppVar32->less_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar6 = (ppVar32->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar35 != pcVar6) {
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_0061bfe0);
    vpmovsxwd_avx2(_DAT_0061bff0);
    piVar7 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar53 = vpbroadcastq_avx512f();
    auVar53 = vpsrlq_avx512f(auVar53,5);
    uVar37 = (ulong)((long)pcVar6 + (-0x30 - (long)pcVar35)) / 0x30 + 8 & 0xffffffffffffff8;
    uVar36 = 0;
    do {
      auVar54 = vpbroadcastq_avx512f();
      auVar54 = vporq_avx512f(auVar54,auVar52);
      uVar16 = vpcmpuq_avx512f(auVar54,auVar53,2);
      auVar54 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pcVar35->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar37));
      bVar14 = (byte)uVar16;
      auVar58._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar54._8_8_;
      auVar58._0_8_ = (ulong)(bVar14 & 1) * auVar54._0_8_;
      auVar58._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar54._16_8_;
      auVar58._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar54._24_8_;
      auVar58._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar54._32_8_;
      auVar58._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar54._40_8_;
      auVar58._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar54._48_8_;
      auVar58._56_8_ = (uVar16 >> 7) * auVar54._56_8_;
      auVar54 = vpgatherdq_avx512f(*(undefined4 *)((long)&(pcVar35->label)._M_len + uVar38));
      auVar59._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * auVar54._8_8_;
      auVar59._0_8_ = (ulong)(bVar14 & 1) * auVar54._0_8_;
      auVar59._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * auVar54._16_8_;
      auVar59._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * auVar54._24_8_;
      auVar59._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * auVar54._32_8_;
      auVar59._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * auVar54._40_8_;
      auVar59._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * auVar54._48_8_;
      auVar59._56_8_ = (uVar16 >> 7) * auVar54._56_8_;
      pcVar35 = pcVar35 + 8;
      auVar54 = vpsubq_avx512f(auVar59,auVar58);
      auVar54 = vpsrlq_avx512f(auVar54,3);
      pauVar1 = (undefined1 (*) [32])(piVar7 + uVar36);
      auVar48 = vpmovqd_avx512f(auVar54);
      auVar4 = *pauVar1;
      auVar51._0_4_ = (uint)(bVar14 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar4._0_4_;
      bVar21 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar21 * auVar48._4_4_ | (uint)!bVar21 * auVar4._4_4_;
      bVar21 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar21 * auVar48._8_4_ | (uint)!bVar21 * auVar4._8_4_;
      bVar21 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar21 * auVar48._12_4_ | (uint)!bVar21 * auVar4._12_4_;
      bVar21 = (bool)((byte)(uVar16 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar21 * auVar48._16_4_ | (uint)!bVar21 * auVar4._16_4_;
      bVar21 = (bool)((byte)(uVar16 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar21 * auVar48._20_4_ | (uint)!bVar21 * auVar4._20_4_;
      bVar21 = (bool)((byte)(uVar16 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar21 * auVar48._24_4_ | (uint)!bVar21 * auVar4._24_4_;
      bVar21 = SUB81(uVar16 >> 7,0);
      auVar51._28_4_ = (uint)bVar21 * auVar48._28_4_ | (uint)!bVar21 * auVar4._28_4_;
      *pauVar1 = auVar51;
      uVar36 = uVar36 + 8;
    } while (uVar37 != uVar36);
  }
  if ((-1 < variable_index) &&
     (variable_index <
      (int)((ulong)((long)(this->cache).
                          super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->cache).
                         super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39)) {
    pp_lifo::emplace(&this->lifo,variable_index,variable_value);
    affects(this);
    poVar8 = (this->merge_obj).elements.
             super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->merge_obj).elements.
        super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
        ._M_impl.super__Vector_impl_data._M_finish != poVar8) {
      (this->merge_obj).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = poVar8;
    }
    local_250 = (vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                 *)&this->merge_obj;
    (this->merge_obj).value = 0.0;
    local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
    iVar44 = (int)((ulong)((long)(this->cache).
                                 super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->cache).
                                super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
    local_258 = this_01;
    if (iVar44 != 0) {
      do {
        iVar25 = std::
                 _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(this_01,(key_type *)local_2d8);
        iVar23 = local_2d8._0_4_;
        if ((iVar25.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
             (__node_type *)0x0) && (bVar21 = is_unused_variable(this,local_2d8._0_4_), bVar21)) {
          poVar9 = (this->pb->objective).qelements.
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          poVar27 = (this->pb->objective).qelements.
                    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar38 = (long)poVar9 - (long)poVar27;
          if ((long)uVar38 >> 6 < 1) goto LAB_0012ed96;
          lVar34 = ((long)uVar38 >> 6) + 1;
          poVar26 = (pointer)((long)&poVar27->factor + (uVar38 & 0xffffffffffffffc0));
          poVar41 = poVar27 + 2;
          do {
            if (poVar41[-2].variable_index_a == iVar23) goto LAB_0012ec89;
            if (poVar41[-2].variable_index_b == iVar23) goto LAB_0012ec89;
            if (poVar41[-1].variable_index_a == iVar23) goto LAB_0012edf7;
            if (poVar41[-1].variable_index_b == iVar23) goto LAB_0012edf7;
            if (poVar41->variable_index_a == iVar23) goto LAB_0012ec8d;
            if (poVar41->variable_index_b == iVar23) goto LAB_0012ec8d;
            if (poVar41[1].variable_index_a == iVar23) goto LAB_0012ee00;
            if (poVar41[1].variable_index_b == iVar23) goto LAB_0012ee00;
            lVar34 = lVar34 + -1;
            poVar41 = poVar41 + 4;
          } while (1 < lVar34);
LAB_0012ed90:
          uVar38 = (long)poVar9 - (long)poVar26;
          poVar27 = poVar26;
LAB_0012ed96:
          lVar34 = (long)uVar38 >> 4;
          if (lVar34 != 1) {
            if (lVar34 != 2) {
              if (lVar34 != 3) goto LAB_0012edde;
              poVar41 = poVar27;
              if ((poVar27->variable_index_a == iVar23) || (poVar27->variable_index_b == iVar23))
              goto LAB_0012ec8d;
              poVar27 = poVar27 + 1;
            }
            poVar41 = poVar27;
            if ((poVar27->variable_index_a == iVar23) || (poVar27->variable_index_b == iVar23))
            goto LAB_0012ec8d;
            poVar27 = poVar27 + 1;
          }
          poVar41 = poVar9;
          if (poVar27->variable_index_b == iVar23) {
            poVar41 = poVar27;
          }
          if (poVar27->variable_index_a == iVar23) {
            poVar41 = poVar27;
          }
LAB_0012ec8d:
          if (poVar41 == poVar9) goto LAB_0012edde;
          dVar3 = poVar41->factor;
          if (this->pb->type == maximize) {
            if (0.0 < dVar3) goto LAB_0012ecbd;
          }
          else if (dVar3 < 0.0) {
LAB_0012ecbd:
            iVar22 = poVar41->variable_index_a;
            if (iVar22 == poVar41->variable_index_b) {
              (this->merge_obj).value = dVar3 * 0.5 + (this->merge_obj).value;
            }
            else {
              iVar33 = poVar41->variable_index_b;
              if (iVar22 != iVar23) {
                iVar33 = iVar22;
              }
              local_288._0_4_ = iVar33;
              local_248 = (undefined1  [8])(dVar3 * 0.5);
              std::
              vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
              ::emplace_back<double,int_const&>(local_250,(double *)local_248,(int *)local_288);
              iVar23 = local_2d8._0_4_;
            }
          }
          poVar27 = poVar41 + 1;
          uVar38 = (long)poVar9 - (long)poVar27;
          if (0 < (long)uVar38 >> 6) {
            lVar34 = ((long)uVar38 >> 6) + 1;
            poVar41 = poVar41 + 3;
            poVar26 = (pointer)((long)&poVar27->factor + (uVar38 & 0xffffffffffffffc0));
            while ((poVar41[-2].variable_index_a != iVar23 &&
                   (poVar41[-2].variable_index_b != iVar23))) {
              if ((poVar41[-1].variable_index_a == iVar23) ||
                 (poVar41[-1].variable_index_b == iVar23)) goto LAB_0012edf7;
              if ((poVar41->variable_index_a == iVar23) || (poVar41->variable_index_b == iVar23))
              goto LAB_0012ec8d;
              if ((poVar41[1].variable_index_a == iVar23) || (poVar41[1].variable_index_b == iVar23)
                 ) goto LAB_0012ee00;
              lVar34 = lVar34 + -1;
              poVar41 = poVar41 + 4;
              if (lVar34 < 2) goto LAB_0012ed90;
            }
LAB_0012ec89:
            poVar41 = poVar41 + -2;
            goto LAB_0012ec8d;
          }
          goto LAB_0012ed96;
        }
LAB_0012edde:
        this_00 = local_258;
        local_2d8._0_4_ = iVar23 + 1;
      } while (iVar23 + 1 != iVar44);
      auVar60._12_4_ = 0;
      auVar60._0_12_ = stack0xfffffffffffffdbc;
      _local_248 = auVar60 << 0x20;
      iVar44 = (int)((ulong)((long)(this->cache).
                                   super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->cache).
                                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      if (iVar44 != 0) {
        do {
          iVar25 = std::
                   _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(this_01,(key_type *)local_248);
          iVar23 = local_248._0_4_;
          if ((iVar25.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
               (__node_type *)0x0) && (bVar21 = is_unused_variable(this,local_248._0_4_), bVar21)) {
            ppVar32 = this->pb;
            poVar8 = (ppVar32->objective).elements.
                     super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            poVar40 = (ppVar32->objective).elements.
                      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar38 = (long)poVar8 - (long)poVar40;
            if (0 < (long)uVar38 >> 6) {
              in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                      (uVar38 & 0xffffffffffffffc0);
              lVar34 = ((long)uVar38 >> 6) + 1;
              poVar39 = (pointer)((long)&poVar40->factor +
                                 (long)&in_R8->
                                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                 );
              poVar40 = poVar40 + 2;
              do {
                if (poVar40[-2].variable_index == iVar23) {
                  poVar40 = poVar40 + -2;
                  goto LAB_0012ef15;
                }
                if (poVar40[-1].variable_index == iVar23) {
                  poVar40 = poVar40 + -1;
                  goto LAB_0012ef15;
                }
                if (poVar40->variable_index == iVar23) goto LAB_0012ef15;
                if (poVar40[1].variable_index == iVar23) {
                  poVar40 = poVar40 + 1;
                  goto LAB_0012ef15;
                }
                lVar34 = lVar34 + -1;
                poVar40 = poVar40 + 4;
              } while (1 < lVar34);
              uVar38 = (long)poVar8 - (long)poVar39;
              poVar40 = poVar39;
            }
            in_R8 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                    ((long)uVar38 >> 4);
            if (in_R8 == (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x1)
            {
LAB_0012eef9:
              if (poVar40->variable_index != iVar23) {
                poVar40 = poVar8;
              }
LAB_0012ef15:
              if (poVar40 == poVar8) {
                bVar21 = true;
              }
              else {
                dVar3 = poVar40->factor;
                if (ppVar32->type == maximize) {
                  bVar21 = dVar3 < 0.0;
                }
                else {
                  bVar21 = 0.0 < dVar3;
                }
                bVar21 = !bVar21 && dVar3 != 0.0;
              }
            }
            else {
              if (in_R8 == (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                           0x2) {
LAB_0012eef0:
                if (poVar40->variable_index != iVar23) {
                  poVar40 = poVar40 + 1;
                  goto LAB_0012eef9;
                }
                goto LAB_0012ef15;
              }
              bVar21 = true;
              if (in_R8 == (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                           0x3) {
                if (poVar40->variable_index != iVar23) {
                  poVar40 = poVar40 + 1;
                  goto LAB_0012eef0;
                }
                goto LAB_0012ef15;
              }
            }
            pmVar28 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,(key_type *)local_248);
            *pmVar28 = bVar21;
            this_01 = this_00;
            iVar23 = local_248._0_4_;
          }
          local_248._0_4_ = iVar23 + 1;
        } while (iVar23 + 1 != iVar44);
      }
    }
    affects(this);
    local_2d8._0_8_ = (this->vars)._M_h._M_element_count;
    pcVar10 = this->ctx;
    sVar29 = baryonyx::memory_consumed(this->pb);
    auVar60 = vcvtusi2sd_avx512f(in_XMM6,sVar29);
    local_40[0] = 0;
    dVar3 = auVar60._0_8_ * 0.0009765625;
    dVar15 = dVar3 * 0.0009765625;
    local_38 = dVar15 * 0.0009765625;
    if ((dVar15 * 0.0009765625 <= 0.5) && (local_40[0] = 1, local_38 = dVar15, dVar15 <= 0.5)) {
      bVar21 = 0.5 < dVar3;
      local_40[0] = bVar21 ^ 3;
      local_38 = (double)((ulong)bVar21 * (long)dVar3 + (ulong)!bVar21 * (long)auVar60._0_8_);
    }
    baryonyx::to_string_abi_cxx11_((string *)local_248,(baryonyx *)local_40,mem);
    baryonyx::info<unsigned_long,std::__cxx11::string>
              (pcVar10,"  - Preprocessor finish. Removed variables {} (size: {})\n",
               (unsigned_long *)local_2d8,(string *)local_248);
    if (local_248 != (undefined1  [8])auStack_238) {
      operator_delete((void *)local_248,(long)auStack_238 + 1);
    }
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->type = maximize;
    __return_storage_ptr__->problem_type = equalities_01;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).value = 0.0;
    ppVar32 = this->pb;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ppVar32->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(ppVar32->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    ppVar32 = this->pb;
    __return_storage_ptr__->type = ppVar32->type;
    local_248._0_5_ = 0xffffffff;
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_2a8,
               ((long)(ppVar32->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(ppVar32->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type *)local_248,(allocator_type *)local_2d8);
    auVar20._12_4_ = 0;
    auVar20._0_12_ = stack0xfffffffffffffdbc;
    _local_248 = auVar20 << 0x20;
    ppVar32 = this->pb;
    iVar44 = (int)((ulong)((long)(ppVar32->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(ppVar32->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    if (iVar44 == 0) {
      iVar44 = 0;
      iVar23 = 0;
    }
    else {
      uVar38 = 0;
      do {
        cVar30 = std::
                 _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(this_01,(key_type *)local_248);
        if (cVar30.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar37 = (ulong)((int)uVar38 + 1);
          uVar36 = uVar38;
        }
        else {
          uVar36 = ((ulong)*(byte *)((long)cVar30.
                                           super__Node_iterator_base<std::pair<const_int,_bool>,_false>
                                           ._M_cur + 0xc) << 0x20) + 0xffffffff;
          uVar37 = uVar38;
        }
        iVar23 = (int)uVar37;
        *(int *)(&((solver_parameters *)local_2a8._0_8_)->time_limit + (int)local_248._0_4_) =
             (int)uVar36;
        *(char *)((long)&((solver_parameters *)local_2a8._0_8_)->time_limit +
                 (long)(int)local_248._0_4_ * 8 + 4) = (char)(uVar36 >> 0x20);
        iVar22 = local_248._0_4_ + 1;
        local_248._0_4_ = iVar22;
        uVar38 = uVar37;
      } while (iVar22 != iVar44);
      ppVar32 = this->pb;
      iVar44 = (int)((ulong)((long)(ppVar32->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(ppVar32->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    }
    if (iVar23 == iVar44 - (int)(this->vars)._M_h._M_element_count) {
      poStack_220 = (pointer)0x0;
      _local_248 = ZEXT816(0);
      auStack_238 = (undefined1  [8])0x0;
      auStack_230 = ZEXT816(0);
      local_218 = (pointer)((ppVar32->objective).value + (this->merge_obj).value);
      uVar38 = (long)(ppVar32->objective).elements.
                     super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(ppVar32->objective).elements.
                     super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar38 & 0xffffffff0) != 0) {
        lVar34 = 0;
        uVar38 = uVar38 >> 4 & 0xffffffff;
        do {
          poVar8 = (this->pb->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __args_02 = (double *)((long)&poVar8->factor + lVar34);
          pdVar2 = &((solver_parameters *)local_2a8._0_8_)->time_limit +
                   *(int *)((long)&poVar8->variable_index + lVar34);
          if (*(int *)pdVar2 == -1) {
            if (*(bool *)((long)pdVar2 + 4) == true) {
              local_218 = (pointer)(*__args_02 + (double)local_218);
            }
          }
          else {
            std::
            vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
            ::emplace_back<double_const&,int_const&>
                      ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                        *)local_248,__args_02,(int *)pdVar2);
          }
          lVar34 = lVar34 + 0x10;
          uVar38 = uVar38 - 1;
        } while (uVar38 != 0);
        ppVar32 = this->pb;
      }
      uVar38 = (long)(ppVar32->objective).qelements.
                     super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(ppVar32->objective).qelements.
                     super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar38 & 0xffffffff0) != 0) {
        lVar34 = 0;
        uVar38 = uVar38 >> 4 & 0xffffffff;
        do {
          poVar27 = (this->pb->objective).qelements.
                    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar2 = (double *)((long)&poVar27->factor + lVar34);
          local_2d8._0_8_ =
               (&((solver_parameters *)local_2a8._0_8_)->time_limit)
               [*(int *)((long)&poVar27->variable_index_a + lVar34)];
          local_288._0_8_ =
               (&((solver_parameters *)local_2a8._0_8_)->time_limit)
               [*(int *)((long)&poVar27->variable_index_b + lVar34)];
          if ((int)local_2d8._0_8_ == -1) {
            __args_1 = (int *)local_288;
            if ((int)local_288._0_8_ == -1) {
              if (((local_2d8._0_8_ & 0x100000000) != 0) && ((local_288._0_8_ & 0x100000000) != 0))
              {
                local_218 = (pointer)(*pdVar2 + (double)local_218);
              }
            }
            else {
LAB_0012f2ce:
              std::
              vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
              ::emplace_back<double_const&,int&>
                        ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                          *)local_248,pdVar2,__args_1);
            }
          }
          else {
            __args_1 = (int *)local_2d8;
            if ((int)local_288._0_8_ == -1) goto LAB_0012f2ce;
            std::
            vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
            ::emplace_back<double_const&,int&,int&>
                      ((vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
                        *)auStack_230,pdVar2,__args_1,(int *)local_288);
          }
          lVar34 = lVar34 + 0x10;
          uVar38 = uVar38 - 1;
        } while (uVar38 != 0);
      }
      uVar38 = (long)(this->merge_obj).elements.
                     super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->merge_obj).elements.
                     super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar38 & 0xffffffff0) != 0) {
        uVar36 = 0;
        do {
          uVar37 = (long)vStack_240 - (long)local_248;
          vVar31 = (value_type)local_248;
          if (0 < (long)uVar37 >> 6) {
            lVar34 = ((long)uVar37 >> 6) + 1;
            vVar31 = (value_type)((uVar37 & 0xffffffffffffffc0) + (long)local_248);
            __args = (value_type)((long)local_248 + 0x20);
            do {
              if (uVar36 == *(uint *)((long)__args + -0x18)) {
                __args = (value_type)((long)__args + -0x20);
                goto LAB_0012f3ee;
              }
              if (uVar36 == *(uint *)((long)__args + -8)) {
                __args = (value_type)((long)__args + -0x10);
                goto LAB_0012f3ee;
              }
              if (uVar36 == *(uint *)((long)__args + 8)) goto LAB_0012f3ee;
              if (uVar36 == *(uint *)((long)__args + 0x18)) {
                __args = (value_type)((long)__args + 0x10);
                goto LAB_0012f3ee;
              }
              lVar34 = lVar34 + -1;
              __args = (value_type)((long)__args + 0x40);
            } while (1 < lVar34);
            uVar37 = (long)vStack_240 - (long)vVar31;
          }
          lVar34 = (long)uVar37 >> 4;
          if (lVar34 == 1) {
LAB_0012f3cf:
            __args = vVar31;
            if (uVar36 != *(uint *)((long)vVar31 + 8)) {
              __args = vStack_240;
            }
LAB_0012f3ee:
            if (__args == vStack_240) goto LAB_0012f417;
            *(double *)__args = *(double *)(*(long *)local_250 + uVar36 * 0x10) + *(double *)__args;
          }
          else {
            if (lVar34 == 2) {
LAB_0012f3c3:
              __args = vVar31;
              if (uVar36 != *(uint *)((long)vVar31 + 8)) {
                vVar31 = (value_type)((long)vVar31 + 0x10);
                goto LAB_0012f3cf;
              }
              goto LAB_0012f3ee;
            }
            __args = vStack_240;
            if (lVar34 == 3) {
              __args = vVar31;
              if (uVar36 != *(uint *)((long)vVar31 + 8)) {
                vVar31 = (value_type)((long)vVar31 + 0x10);
                goto LAB_0012f3c3;
              }
              goto LAB_0012f3ee;
            }
LAB_0012f417:
            std::
            vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
            ::emplace_back<double&,int&>
                      ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                        *)local_248,(double *)__args,(int *)((long)__args + 8));
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != (uVar38 >> 4 & 0xffffffff));
      }
      auVar19 = auStack_238;
      poVar8 = (__return_storage_ptr__->objective).elements.
               super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar40 = (__return_storage_ptr__->objective).elements.
                super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar60 = ZEXT816(0) << 0x40;
      auStack_238 = (undefined1  [8])0x0;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_248;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)vStack_240;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auVar19;
      _local_248 = auVar60;
      if (poVar8 != (pointer)0x0) {
        operator_delete(poVar8,(long)poVar40 - (long)poVar8);
        auVar60 = ZEXT816(0) << 0x40;
      }
      poVar41 = poStack_220;
      poVar27 = (__return_storage_ptr__->objective).qelements.
                super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar9 = (__return_storage_ptr__->objective).qelements.
               super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      poStack_220 = (pointer)0x0;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_230._0_8_;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_230._8_8_;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar41;
      if (poVar27 == (pointer)0x0) {
        (__return_storage_ptr__->objective).value = (double)local_218;
        auVar20 = auVar60;
      }
      else {
        auStack_230 = auVar60;
        operator_delete(poVar27,(long)poVar9 - (long)poVar27);
        (__return_storage_ptr__->objective).value = (double)local_218;
        auVar20 = auStack_230;
        if ((void *)auStack_230._0_8_ != (void *)0x0) {
          operator_delete((void *)auStack_230._0_8_,(long)poStack_220 - auStack_230._0_8_);
          auVar20 = auStack_230;
        }
      }
      auStack_230 = auVar20;
      if ((value_type)local_248 != (value_type)0x0) {
        operator_delete((void *)local_248,(long)auStack_238 - (long)local_248);
      }
      ppVar32 = this->pb;
      sVar11 = (this->vars)._M_h._M_element_count;
      vStack_2c0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_2c0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8._0_8_ = (pointer)0x0;
      local_2d8._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      local_2d8._16_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      vStack_2c0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_2d8,
                ((long)(ppVar32->affected_vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(ppVar32->affected_vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar11);
      std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                (&vStack_2c0,
                 (size_type)
                 ((ppVar32->affected_vars).values.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                 (sVar11 - (long)(ppVar32->affected_vars).values.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::basic_string_view<char,std::char_traits<char>>const*,std::back_insert_iterator<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                ((ppVar32->affected_vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (ppVar32->affected_vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_2d8);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<signed_char_const*,std::back_insert_iterator<std::vector<signed_char,std::allocator<signed_char>>>>
                ((ppVar32->affected_vars).values.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (ppVar32->affected_vars).values.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vStack_2c0);
      vStack_270.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (variable_value *)0x0;
      vStack_270.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (variable_value *)0x0;
      local_288._0_8_ = (pointer)0x0;
      local_288._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      local_288._16_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      vStack_270.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      auVar52 = ZEXT1664(auVar60);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_288,
                ((long)(this->pb->vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->pb->vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) -
                (this->vars)._M_h._M_element_count);
      std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::reserve
                (&vStack_270,
                 ((long)(this->pb->vars).names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pb->vars).names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) -
                 (this->vars)._M_h._M_element_count);
      lVar34 = (long)(this->pb->vars).values.
                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->pb->vars).values.
                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar34 != 0) {
        lVar42 = 0;
        lVar47 = 0;
        lVar46 = 0;
        do {
          local_2a8._28_4_ = (undefined4)lVar46;
          cVar30 = std::
                   _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_258,(key_type *)(local_2a8 + 0x1c));
          __args_00 = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((long)&((this->pb->vars).names.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar42);
          if (cVar30.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
              (__node_type *)0x0) {
            if (local_288._8_8_ == local_288._16_8_) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_288,(iterator)local_288._8_8_,__args_00);
            }
            else {
              pcVar17 = __args_00->_M_str;
              *(size_t *)local_288._8_8_ = __args_00->_M_len;
              *(char **)(local_288._8_8_ + 8) = pcVar17;
              local_288._8_8_ = local_288._8_8_ + 0x10;
            }
            __args_01 = (variable_value *)
                        ((long)&((this->pb->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->min + lVar47);
            if (vStack_270.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                vStack_270.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
              _M_realloc_insert<baryonyx::variable_value_const&>
                        ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>
                          *)&vStack_270,
                         (iterator)
                         vStack_270.
                         super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args_01);
            }
            else {
              (vStack_270.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_finish)->type = __args_01->type;
              iVar44 = __args_01->max;
              (vStack_270.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_finish)->min = __args_01->min;
              (vStack_270.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_finish)->max = iVar44;
              vStack_270.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   vStack_270.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            if (local_2d8._8_8_ == local_2d8._16_8_) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_2d8,(iterator)local_2d8._8_8_,__args_00);
            }
            else {
              pcVar17 = __args_00->_M_str;
              *(size_t *)local_2d8._8_8_ = __args_00->_M_len;
              *(char **)(local_2d8._8_8_ + 8) = pcVar17;
              local_2d8._8_8_ = local_2d8._8_8_ + 0x10;
            }
            std::vector<signed_char,std::allocator<signed_char>>::emplace_back<bool_const&>
                      ((vector<signed_char,std::allocator<signed_char>> *)&vStack_2c0,
                       (bool *)((long)cVar30.
                                      super__Node_iterator_base<std::pair<const_int,_bool>,_false>.
                                      _M_cur + 0xc));
          }
          lVar46 = lVar46 + 1;
          lVar47 = lVar47 + 0xc;
          lVar42 = lVar42 + 0x10;
        } while ((lVar34 >> 2) * -0x5555555555555555 - lVar46 != 0);
      }
      std::_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables>::
      _Tuple_impl<baryonyx::variables&,baryonyx::affected_variables&,void>
                ((_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables> *)local_248,
                 (variables *)local_288,(affected_variables *)local_2d8);
      if (vStack_270.
          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_270.
                        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_270.
                              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_270.
                              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
      }
      if (vStack_2c0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_2c0.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_2c0.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_2c0.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
      }
      local_2d8._0_8_ = &__return_storage_ptr__->affected_vars;
      local_2d8._8_8_ = &__return_storage_ptr__->vars;
      std::_Tuple_impl<0ul,baryonyx::variables&,baryonyx::affected_variables&>::
      _M_assign<baryonyx::variables,baryonyx::affected_variables>
                ((_Tuple_impl<0ul,baryonyx::variables&,baryonyx::affected_variables&> *)local_2d8,
                 (_Tuple_impl<0UL,_baryonyx::variables,_baryonyx::affected_variables> *)local_248);
      if (local_200 != (pointer)0x0) {
        operator_delete(local_200,(long)local_1f0 - (long)local_200);
      }
      if (local_218 != (pointer)0x0) {
        operator_delete(local_218,(long)local_208 - (long)local_218);
      }
      if ((void *)auStack_230._0_8_ != (void *)0x0) {
        operator_delete((void *)auStack_230._0_8_,(long)poStack_220 - auStack_230._0_8_);
      }
      if ((value_type)local_248 != (value_type)0x0) {
        operator_delete((void *)local_248,(long)auStack_238 - (long)local_248);
      }
      uVar18 = local_2a8._0_8_;
      auVar60 = auVar52._0_16_;
      ppVar32 = this->pb;
      uVar45 = (int)((ulong)((long)(ppVar32->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(ppVar32->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      if (uVar45 != 0) {
        lVar34 = 0;
        do {
          lVar42 = (long)*(int *)((long)&((solver_parameters *)uVar18)->time_limit + lVar34);
          if (-1 < lVar42) {
            pbVar12 = (ppVar32->vars).names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar13 = (__return_storage_ptr__->vars).names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __n = *(size_t *)((long)&pbVar12->_M_len + lVar34 * 2);
            if ((__n != pbVar13[lVar42]._M_len) ||
               ((__n != 0 &&
                (iVar44 = bcmp(*(void **)((long)&pbVar12->_M_str + lVar34 * 2),
                               pbVar13[lVar42]._M_str,__n), iVar44 != 0)))) goto LAB_0012fb1b;
          }
          auVar60 = auVar52._0_16_;
          lVar34 = lVar34 + 8;
        } while ((ulong)uVar45 << 3 != lVar34);
      }
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)local_2a8,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                 &this->equal_constraints,
                 (vector<int,_std::allocator<int>_> *)&ppVar32->equal_constraints,
                 &__return_storage_ptr__->equal_constraints,in_R8);
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)local_2a8,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                 &this->greater_constraints,
                 (vector<int,_std::allocator<int>_> *)&this->pb->greater_constraints,
                 &__return_storage_ptr__->greater_constraints,in_R8);
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)local_2a8,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                 &this->less_constraints,
                 (vector<int,_std::allocator<int>_> *)&this->pb->less_constraints,
                 &__return_storage_ptr__->less_constraints,in_R8);
      pcVar35 = (__return_storage_ptr__->equal_constraints).
                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar44 = (int)((ulong)((long)(__return_storage_ptr__->vars).values.
                                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->vars).values.
                                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar23 = iVar44 * -0x55555555;
      do {
        if (pcVar35 ==
            (__return_storage_ptr__->equal_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pcVar35 = (__return_storage_ptr__->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            if (pcVar35 ==
                (__return_storage_ptr__->greater_constraints).
                super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pcVar35 = (__return_storage_ptr__->less_constraints).
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pcVar35 ==
                    (__return_storage_ptr__->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  pVar24 = baryonyx::problem::which_problem_type(__return_storage_ptr__);
                  __return_storage_ptr__->problem_type = pVar24;
                  pcVar10 = this->ctx;
                  sVar29 = baryonyx::memory_consumed(__return_storage_ptr__);
                  auVar60 = vcvtusi2sd_avx512f(auVar60,sVar29);
                  uVar45 = 0;
                  dVar3 = auVar60._0_8_ * 0.0009765625;
                  pbVar12 = (pointer)(dVar3 * 0.0009765625);
                  local_2d8._8_8_ = (pointer)((double)pbVar12 * 0.0009765625);
                  if (((double)pbVar12 * 0.0009765625 <= 0.5) &&
                     (uVar45 = 1, local_2d8._8_8_ = pbVar12, (double)pbVar12 <= 0.5)) {
                    bVar21 = 0.5 < dVar3;
                    uVar45 = bVar21 ^ 3;
                    local_2d8._8_8_ =
                         (ulong)bVar21 * (long)dVar3 + (ulong)!bVar21 * (long)auVar60._0_8_;
                  }
                  local_2d8._0_4_ = uVar45;
                  baryonyx::to_string_abi_cxx11_((string *)local_248,(baryonyx *)local_2d8,mem_00);
                  baryonyx::info<std::__cxx11::string>
                            (pcVar10,"- Preprocessing finishes (size: {})\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_248);
                  if (local_248 != (undefined1  [8])auStack_238) {
                    operator_delete((void *)local_248,(long)auStack_238 + 1);
                  }
                  std::ofstream::ofstream(local_248,"preprocessed.lp",_S_out);
                  baryonyx::operator<<((ostream *)local_248,__return_storage_ptr__);
                  local_248 = (undefined1  [8])_VTT;
                  *(undefined8 *)(local_248 + *(long *)(_VTT + -0x18)) = _log;
                  std::filebuf::~filebuf((filebuf *)&vStack_240);
                  ppVar32 = (problem *)std::ios_base::~ios_base(local_150);
                  if ((context *)local_2a8._0_8_ != (context *)0x0) {
                    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
                    ppVar32 = extraout_RAX;
                  }
                  return ppVar32;
                }
                for (pfVar43 = (pcVar35->elements).
                               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pfVar43 !=
                    (pcVar35->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pfVar43 = pfVar43 + 1) {
                  iVar22 = pfVar43->variable_index;
                  if ((iVar22 < 0) || (SBORROW4(iVar22,iVar23) == iVar22 + iVar44 * 0x55555555 < 0))
                  goto LAB_0012fb16;
                }
                pcVar35 = pcVar35 + 1;
              } while( true );
            }
            for (pfVar43 = (pcVar35->elements).
                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pfVar43 !=
                (pcVar35->elements).
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                ._M_impl.super__Vector_impl_data._M_finish; pfVar43 = pfVar43 + 1) {
              iVar22 = pfVar43->variable_index;
              if ((iVar22 < 0) || (SBORROW4(iVar22,iVar23) == iVar22 + iVar44 * 0x55555555 < 0))
              goto LAB_0012fb16;
            }
            pcVar35 = pcVar35 + 1;
          } while( true );
        }
        for (pfVar43 = (pcVar35->elements).
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pfVar43 !=
            (pcVar35->elements).
            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
            ._M_impl.super__Vector_impl_data._M_finish; pfVar43 = pfVar43 + 1) {
          iVar22 = pfVar43->variable_index;
          if ((iVar22 < 0) || (SBORROW4(iVar22,iVar23) == iVar22 + iVar44 * 0x55555555 < 0))
          goto LAB_0012fb16;
        }
        pcVar35 = pcVar35 + 1;
      } while( true );
    }
    goto LAB_0012fb28;
  }
  goto LAB_0012fb20;
LAB_0012edf7:
  poVar41 = poVar41 + -1;
  goto LAB_0012ec8d;
LAB_0012ee00:
  poVar41 = poVar41 + 1;
  goto LAB_0012ec8d;
LAB_0012fb16:
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
LAB_0012fb1b:
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
LAB_0012fb20:
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
LAB_0012fb28:
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
  std::ofstream::~ofstream(local_248);
  if ((context *)local_2a8._0_8_ != (context *)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  baryonyx::problem::~problem(__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

bx::problem operator()(int variable_index, bool variable_value)
    {
        vars.clear();
        lifo.clear();
        init_constraints_length_container();

        affect_variable(variable_index, variable_value);
        affects();

        make_lp_from_bqp_objective();
        try_remove_unused_variable();
        affects();

        info(ctx,
             "  - Preprocessor finish. Removed variables {} (size: {})\n",
             vars.size(),
             to_string(bx::memory_consumed_size(memory_consumed(pb))));

        return make_problem();
    }